

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O0

void ncnn::crop_pack16_avx512(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  __m512 _p;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int right;
  int h;
  int w;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined8 *local_110;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  iVar2 = *(int *)(in_RSI + 6);
  iVar3 = *(int *)((long)in_RDI + 0x2c);
  iVar4 = *(int *)((long)in_RSI + 0x2c);
  local_110 = (undefined8 *)
              (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_EDX * in_RDI[2] +
              (long)(in_ECX << 4) * 4);
  local_118 = (undefined8 *)*in_RSI;
  for (local_11c = 0; local_11c < iVar2; local_11c = local_11c + 1) {
    for (local_120 = 0; local_120 < iVar1; local_120 = local_120 + 1) {
      uVar5 = local_110[1];
      uVar6 = local_110[2];
      uVar7 = local_110[3];
      uVar8 = local_110[4];
      uVar9 = local_110[5];
      uVar10 = local_110[6];
      uVar11 = local_110[7];
      *local_118 = *local_110;
      local_118[1] = uVar5;
      local_118[2] = uVar6;
      local_118[3] = uVar7;
      local_118[4] = uVar8;
      local_118[5] = uVar9;
      local_118[6] = uVar10;
      local_118[7] = uVar11;
      local_110 = local_110 + 8;
      local_118 = local_118 + 8;
    }
    local_110 = (undefined8 *)((long)local_110 + (long)((iVar3 - iVar4) * 0x10) * 4);
  }
  return;
}

Assistant:

static void crop_pack16_avx512(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 16;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }

        ptr += (left + right) * 16;
    }
}